

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::ParseTextureColorData
          (MDLImporter *this,uchar *szData,uint iType,uint *piSkip,aiTexture *pcNew)

{
  undefined1 auVar1 [16];
  byte bVar2;
  ulong uVar3;
  aiTexel *paVar4;
  uchar *puVar5;
  bool bVar6;
  uchar *sz;
  uchar *puStack_70;
  uchar val_2;
  uchar *szColorMap;
  uint i_4;
  uchar *_szData_1;
  uchar *puStack_50;
  uint i_3;
  uchar *_szData;
  uint i_2;
  ARGB4 val_1;
  uint i_1;
  RGB565 val;
  uint i;
  bool do_read;
  aiTexture *pcNew_local;
  uint *piSkip_local;
  uint iType_local;
  uchar *szData_local;
  MDLImporter *this_local;
  
  bVar6 = pcNew->pcData != (aiTexel *)0xffffffffffffffff;
  if (bVar6) {
    auVar1 = ZEXT416(pcNew->mWidth * pcNew->mHeight) * ZEXT816(4);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    paVar4 = (aiTexel *)operator_new__(uVar3);
    pcNew->pcData = paVar4;
  }
  if ((iType == 2) || (iType == 10)) {
    SizeCheck(this,szData + pcNew->mWidth * pcNew->mHeight * 2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0xf9);
    if (bVar6) {
      for (i_1 = 0; i_1 < pcNew->mWidth * pcNew->mHeight; i_1 = i_1 + 1) {
        val_1 = *(ARGB4 *)(szData + (ulong)i_1 * 2);
        pcNew->pcData[i_1].a = 0xff;
        pcNew->pcData[i_1].r = val_1._1_1_ & 0xf8;
        pcNew->pcData[i_1].g = (char)((ushort)val_1 >> 5) << 2;
        pcNew->pcData[i_1].b = val_1._0_1_ << 3;
      }
    }
    else {
      i_1 = pcNew->mWidth * pcNew->mHeight;
    }
    *piSkip = i_1 << 1;
    if (iType == 10) {
      *piSkip = ((i_1 >> 2) + (i_1 >> 4) + (i_1 >> 6)) * 2 + *piSkip;
      SizeCheck(this,szData + *piSkip,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
                ,0x111);
    }
  }
  else if ((iType == 3) || (iType == 0xb)) {
    SizeCheck(this,szData + pcNew->mWidth * pcNew->mHeight * 4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x118);
    if (bVar6) {
      for (i_2 = 0; i_2 < pcNew->mWidth * pcNew->mHeight; i_2 = i_2 + 1) {
        _szData._6_2_ = *(ushort *)(szData + (ulong)i_2 * 2);
        pcNew->pcData[i_2].a = (char)_szData._6_2_ << 4;
        pcNew->pcData[i_2].r = (char)(_szData._6_2_ >> 4) << 4;
        bVar2 = (byte)(_szData._6_2_ >> 8);
        pcNew->pcData[i_2].g = bVar2 << 4;
        pcNew->pcData[i_2].b = bVar2 & 0xf0;
      }
    }
    else {
      i_2 = pcNew->mWidth * pcNew->mHeight;
    }
    *piSkip = i_2 << 1;
    if (iType == 0xb) {
      *piSkip = ((i_2 >> 2) + (i_2 >> 4) + (i_2 >> 6)) * 2 + *piSkip;
      SizeCheck(this,szData + *piSkip,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
                ,0x130);
    }
  }
  else if ((iType == 4) || (iType == 0xc)) {
    SizeCheck(this,szData + pcNew->mWidth * pcNew->mHeight * 3,
              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x137);
    if (bVar6) {
      for (_szData._0_4_ = 0; (uint)_szData < pcNew->mWidth * pcNew->mHeight;
          _szData._0_4_ = (uint)_szData + 1) {
        puVar5 = szData + (uint)_szData * 3;
        pcNew->pcData[(uint)_szData].a = 0xff;
        pcNew->pcData[(uint)_szData].b = *puVar5;
        puStack_50 = puVar5 + 2;
        pcNew->pcData[(uint)_szData].g = puVar5[1];
        pcNew->pcData[(uint)_szData].r = *puStack_50;
      }
    }
    else {
      _szData._0_4_ = pcNew->mWidth * pcNew->mHeight;
    }
    *piSkip = (uint)_szData * 3;
    if (iType == 0xc) {
      *piSkip = (((uint)_szData >> 2) + ((uint)_szData >> 4) + ((uint)_szData >> 6)) * 3 + *piSkip;
      SizeCheck(this,szData + *piSkip,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
                ,0x14f);
    }
  }
  else if ((iType == 5) || (iType == 0xd)) {
    SizeCheck(this,szData + pcNew->mWidth * pcNew->mHeight * 4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x156);
    if (bVar6) {
      for (_szData_1._4_4_ = 0; _szData_1._4_4_ < pcNew->mWidth * pcNew->mHeight;
          _szData_1._4_4_ = _szData_1._4_4_ + 1) {
        puVar5 = szData + (_szData_1._4_4_ << 2);
        pcNew->pcData[_szData_1._4_4_].b = *puVar5;
        pcNew->pcData[_szData_1._4_4_].g = puVar5[1];
        pcNew->pcData[_szData_1._4_4_].r = puVar5[2];
        pcNew->pcData[_szData_1._4_4_].a = puVar5[3];
      }
    }
    else {
      _szData_1._4_4_ = pcNew->mWidth * pcNew->mHeight;
    }
    *piSkip = _szData_1._4_4_ << 2;
    if (iType == 0xd) {
      *piSkip = ((_szData_1._4_4_ >> 2) + (_szData_1._4_4_ >> 4) + (_szData_1._4_4_ >> 6)) * 4 +
                *piSkip;
    }
  }
  else if (iType == 0) {
    SizeCheck(this,szData + pcNew->mWidth * pcNew->mHeight,
              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x173);
    if (bVar6) {
      SearchPalette(this,&stack0xffffffffffffff90);
      for (szColorMap._4_4_ = 0; szColorMap._4_4_ < pcNew->mWidth * pcNew->mHeight;
          szColorMap._4_4_ = szColorMap._4_4_ + 1) {
        puVar5 = puStack_70 + (int)((uint)szData[szColorMap._4_4_] * 3);
        pcNew->pcData[szColorMap._4_4_].a = 0xff;
        pcNew->pcData[szColorMap._4_4_].r = *puVar5;
        pcNew->pcData[szColorMap._4_4_].g = puVar5[1];
        pcNew->pcData[szColorMap._4_4_].b = puVar5[2];
      }
      FreePalette(this,puStack_70);
    }
    else {
      szColorMap._4_4_ = pcNew->mWidth * pcNew->mHeight;
    }
    *piSkip = szColorMap._4_4_;
  }
  return;
}

Assistant:

void MDLImporter::ParseTextureColorData(const unsigned char* szData,
    unsigned int iType,
    unsigned int* piSkip,
    aiTexture* pcNew)
{
    const bool do_read = bad_texel != pcNew->pcData;

    // allocate storage for the texture image
    if (do_read) {
        pcNew->pcData = new aiTexel[pcNew->mWidth * pcNew->mHeight];
    }

    // R5G6B5 format (with or without MIPs)
    // ****************************************************************
    if (2 == iType || 10 == iType)
    {
        VALIDATE_FILE_SIZE(szData + pcNew->mWidth*pcNew->mHeight*2);

        // copy texture data
        unsigned int i;
        if (do_read)
        {
            for (i = 0; i < pcNew->mWidth*pcNew->mHeight;++i)
            {
                MDL::RGB565 val = ((MDL::RGB565*)szData)[i];
                AI_SWAP2(val);

                pcNew->pcData[i].a = 0xFF;
                pcNew->pcData[i].r = (unsigned char)val.b << 3;
                pcNew->pcData[i].g = (unsigned char)val.g << 2;
                pcNew->pcData[i].b = (unsigned char)val.r << 3;
            }
        }
        else i = pcNew->mWidth*pcNew->mHeight;
        *piSkip = i * 2;

        // apply MIP maps
        if (10 == iType)
        {
            *piSkip += ((i >> 2) + (i >> 4) + (i >> 6)) << 1;
            VALIDATE_FILE_SIZE(szData + *piSkip);
        }
    }
    // ARGB4 format (with or without MIPs)
    // ****************************************************************
    else if (3 == iType || 11 == iType)
    {
        VALIDATE_FILE_SIZE(szData + pcNew->mWidth*pcNew->mHeight*4);

        // copy texture data
        unsigned int i;
        if (do_read)
        {
            for (i = 0; i < pcNew->mWidth*pcNew->mHeight;++i)
            {
                MDL::ARGB4 val = ((MDL::ARGB4*)szData)[i];
                AI_SWAP2(val);

                pcNew->pcData[i].a = (unsigned char)val.a << 4;
                pcNew->pcData[i].r = (unsigned char)val.r << 4;
                pcNew->pcData[i].g = (unsigned char)val.g << 4;
                pcNew->pcData[i].b = (unsigned char)val.b << 4;
            }
        }
        else i = pcNew->mWidth*pcNew->mHeight;
        *piSkip = i * 2;

        // apply MIP maps
        if (11 == iType)
        {
            *piSkip += ((i >> 2) + (i >> 4) + (i >> 6)) << 1;
            VALIDATE_FILE_SIZE(szData + *piSkip);
        }
    }
    // RGB8 format (with or without MIPs)
    // ****************************************************************
    else if (4 == iType || 12 == iType)
    {
        VALIDATE_FILE_SIZE(szData + pcNew->mWidth*pcNew->mHeight*3);

        // copy texture data
        unsigned int i;
        if (do_read)
        {
            for (i = 0; i < pcNew->mWidth*pcNew->mHeight;++i)
            {
                const unsigned char* _szData = &szData[i*3];

                pcNew->pcData[i].a = 0xFF;
                pcNew->pcData[i].b = *_szData++;
                pcNew->pcData[i].g = *_szData++;
                pcNew->pcData[i].r = *_szData;
            }
        }
        else i = pcNew->mWidth*pcNew->mHeight;


        // apply MIP maps
        *piSkip = i * 3;
        if (12 == iType)
        {
            *piSkip += ((i >> 2) + (i >> 4) + (i >> 6)) *3;
            VALIDATE_FILE_SIZE(szData + *piSkip);
        }
    }
    // ARGB8 format (with ir without MIPs)
    // ****************************************************************
    else if (5 == iType || 13 == iType)
    {
        VALIDATE_FILE_SIZE(szData + pcNew->mWidth*pcNew->mHeight*4);

        // copy texture data
        unsigned int i;
        if (do_read)
        {
            for (i = 0; i < pcNew->mWidth*pcNew->mHeight;++i)
            {
                const unsigned char* _szData = &szData[i*4];

                pcNew->pcData[i].b = *_szData++;
                pcNew->pcData[i].g = *_szData++;
                pcNew->pcData[i].r = *_szData++;
                pcNew->pcData[i].a = *_szData;
            }
        }
        else i = pcNew->mWidth*pcNew->mHeight;

        // apply MIP maps
        *piSkip = i << 2;
        if (13 == iType)
        {
            *piSkip += ((i >> 2) + (i >> 4) + (i >> 6)) << 2;
        }
    }
    // palletized 8 bit texture. As for Quake 1
    // ****************************************************************
    else if (0 == iType)
    {
        VALIDATE_FILE_SIZE(szData + pcNew->mWidth*pcNew->mHeight);

        // copy texture data
        unsigned int i;
        if (do_read)
        {

            const unsigned char* szColorMap;
            SearchPalette(&szColorMap);

            for (i = 0; i < pcNew->mWidth*pcNew->mHeight;++i)
            {
                const unsigned char val = szData[i];
                const unsigned char* sz = &szColorMap[val*3];

                pcNew->pcData[i].a = 0xFF;
                pcNew->pcData[i].r = *sz++;
                pcNew->pcData[i].g = *sz++;
                pcNew->pcData[i].b = *sz;
            }
            this->FreePalette(szColorMap);

        }
        else i = pcNew->mWidth*pcNew->mHeight;
        *piSkip = i;

        // FIXME: Also support for MIP maps?
    }
}